

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luajit.c
# Opt level: O1

int pmain(lua_State *L)

{
  byte bVar1;
  long lVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  size_t len;
  uint nrec;
  uint uVar6;
  int iVar7;
  long lVar8;
  uint uVar9;
  long *plVar10;
  long lVar11;
  bool bVar12;
  
  lVar2 = smain_0;
  globalL = L;
  luaJIT_version_2_1_1741897244();
  pcVar4 = *(char **)(lVar2 + 8);
  nrec = 1;
  uVar6 = 0;
  if (pcVar4 != (char *)0x0) {
LAB_00107b39:
    if (*pcVar4 != '-') goto LAB_00107bcb;
    bVar1 = pcVar4[1];
    if (bVar1 < 0x4f) {
      if (bVar1 == 0x45) {
        uVar6 = uVar6 | 0x10;
        goto LAB_00107b9f;
      }
      if (bVar1 != 0) {
        if (bVar1 != 0x2d) goto switchD_00107b5a_caseD_63;
        nrec = nrec + 1 | -(uint)(pcVar4[2] != '\0');
      }
      goto LAB_00107bcb;
    }
    switch(bVar1) {
    case 0x62:
      uVar9 = 4;
      if (uVar6 != 0) {
        uVar9 = uVar6;
      }
      nrec = nrec + 1 | -(uint)(uVar6 != 0);
      uVar6 = uVar9;
      goto LAB_00107bcb;
    case 99:
    case 100:
    case 0x66:
    case 0x67:
    case 0x68:
    case 0x6b:
      break;
    case 0x65:
      uVar6 = uVar6 | 4;
    case 0x6a:
    case 0x6c:
      uVar6 = uVar6 | 8;
      if (pcVar4[2] == '\0') {
        if (*(long *)(lVar2 + 8 + (long)(int)nrec * 8) == 0) break;
        nrec = nrec + 1;
      }
LAB_00107b9f:
      lVar11 = (long)(int)nrec;
      nrec = nrec + 1;
      pcVar4 = *(char **)(lVar2 + 8 + lVar11 * 8);
      if (pcVar4 == (char *)0x0) goto LAB_00107bcb;
      goto LAB_00107b39;
    case 0x69:
      if (pcVar4[2] == '\0') {
        uVar6 = uVar6 | 1;
LAB_00107b96:
        if (pcVar4[2] == '\0') {
          uVar6 = uVar6 | 2;
          goto LAB_00107b9f;
        }
      }
      break;
    default:
      if (bVar1 == 0x4f) goto LAB_00107b9f;
      if (bVar1 == 0x76) goto LAB_00107b96;
    }
switchD_00107b5a_caseD_63:
    nrec = 0xffffffff;
  }
LAB_00107bcb:
  if ((int)nrec < 0) {
    pmain_cold_1();
    return 0;
  }
  if ((uVar6 & 0x10) != 0) {
    lua_pushboolean(L,1);
    lua_setfield(L,-10000,"LUA_NOENV");
  }
  lua_gc(L,0,0);
  luaL_openlibs(L);
  lua_gc(L,1,-1);
  lVar11 = (long)(int)smain_1;
  lua_createtable(L,smain_1 - nrec,nrec);
  if (0 < lVar11) {
    lVar8 = 0;
    do {
      lua_pushstring(L,*(char **)(lVar2 + lVar8 * 8));
      lua_rawseti(L,-2,(int)lVar8 - nrec);
      lVar8 = lVar8 + 1;
    } while (lVar11 != lVar8);
  }
  lua_setfield(L,-0x2712,"arg");
  if ((uVar6 & 0x10) == 0) {
    pcVar4 = getenv("LUA_INIT");
    if (pcVar4 == (char *)0x0) {
      smain_2 = 0;
    }
    else if (*pcVar4 == '@') {
      smain_2 = dofile(L,pcVar4 + 1);
    }
    else {
      smain_2 = dostring(L,pcVar4,"=LUA_INIT");
    }
    if (smain_2 != 0) {
      return 0;
    }
  }
  if ((uVar6 & 2) != 0) {
    fputs("LuaJIT 2.1.1741897244 -- Copyright (C) 2005-2023 Mike Pall. https://luajit.org/\n",
          _stdout);
  }
  if (1 < (int)nrec) {
    iVar7 = 1;
    do {
      lVar8 = (long)iVar7;
      lVar11 = *(long *)(lVar2 + lVar8 * 8);
      if (lVar11 != 0) {
        bVar1 = *(byte *)(lVar11 + 1);
        if (bVar1 < 0x6a) {
          if (bVar1 == 0x4f) {
            pcVar4 = (char *)(lVar11 + 2);
            lua_getfield(L,-10000,"_LOADED");
            lua_getfield(L,-1,"jit.opt");
            lua_remove(L,-2);
            lua_getfield(L,-1,"start");
            lua_remove(L,-2);
LAB_00107ee4:
            iVar3 = runcmdopt(L,pcVar4);
          }
          else {
            if (bVar1 != 0x65) {
              if (bVar1 == 0x62) {
                lua_pushlstring(L,"bcsave",6);
                iVar7 = loadjitmodule(L);
                if (iVar7 == 0) {
                  lVar11 = *(long *)(lVar2 + lVar8 * 8);
                  bVar12 = *(char *)(lVar11 + 2) != '\0';
                  if (bVar12) {
                    *(undefined1 *)(lVar11 + 1) = 0x2d;
                    lua_pushstring(L,(char *)(*(long *)(lVar2 + lVar8 * 8) + 1));
                  }
                  uVar6 = (uint)bVar12;
                  pcVar4 = *(char **)(lVar2 + 8 + lVar8 * 8);
                  if (pcVar4 != (char *)0x0) {
                    plVar10 = (long *)(lVar2 + lVar8 * 8 + 0x10);
                    do {
                      lua_pushstring(L,pcVar4);
                      uVar6 = uVar6 + 1;
                      pcVar4 = (char *)*plVar10;
                      plVar10 = plVar10 + 1;
                    } while (pcVar4 != (char *)0x0);
                  }
                  iVar7 = lua_pcall(L,uVar6,0,0);
                  report(L,iVar7);
                  smain_2 = 0xffffffff;
                  return 0;
                }
                smain_2 = 1;
                return 0;
              }
              goto LAB_00107f48;
            }
            if (*(char *)(lVar11 + 2) == '\0') {
              iVar7 = iVar7 + 1;
              pcVar4 = *(char **)(lVar2 + 8 + lVar8 * 8);
            }
            else {
              pcVar4 = (char *)(lVar11 + 2);
            }
            iVar3 = dostring(L,pcVar4,"=(command line)");
          }
          if (iVar3 != 0) {
            smain_2 = 1;
            return 0;
          }
        }
        else {
          if (bVar1 == 0x6a) {
            if (*(char *)(lVar11 + 2) == '\0') {
              iVar7 = iVar7 + 1;
              pcVar4 = *(char **)(lVar2 + 8 + lVar8 * 8);
            }
            else {
              pcVar4 = (char *)(lVar11 + 2);
            }
            pcVar5 = strchr(pcVar4,0x3d);
            if (pcVar5 == (char *)0x0) {
              len = strlen(pcVar4);
            }
            else {
              len = (long)pcVar5 - (long)pcVar4;
            }
            lua_pushlstring(L,pcVar4,len);
            lua_getfield(L,-10000,"_LOADED");
            lua_getfield(L,-1,"jit");
            lua_remove(L,-2);
            lua_pushvalue(L,-2);
            lua_gettable(L,-2);
            iVar3 = lua_type(L,-1);
            if (iVar3 == 6) {
              lua_remove(L,-2);
            }
            else {
              lua_settop(L,-3);
              iVar3 = loadjitmodule(L);
              if (iVar3 != 0) {
                smain_2 = 1;
                return 0;
              }
            }
            lua_remove(L,-2);
            pcVar4 = pcVar5 + 1;
            if (pcVar5 == (char *)0x0) {
              pcVar4 = (char *)0x0;
            }
            goto LAB_00107ee4;
          }
          if (bVar1 == 0x6c) {
            if (*(char *)(lVar11 + 2) == '\0') {
              iVar7 = iVar7 + 1;
              pcVar4 = *(char **)(lVar2 + 8 + lVar8 * 8);
            }
            else {
              pcVar4 = (char *)(lVar11 + 2);
            }
            lua_getfield(L,-0x2712,"require");
            lua_pushstring(L,pcVar4);
            iVar3 = docall(L,1,1);
            report(L,iVar3);
            if (iVar3 != 0) {
              smain_2 = 1;
              return 0;
            }
          }
        }
      }
LAB_00107f48:
      iVar7 = iVar7 + 1;
    } while (iVar7 < (int)nrec);
  }
  smain_2 = 0;
  if ((int)nrec < (int)smain_1) {
    pcVar4 = *(char **)(lVar2 + (ulong)nrec * 8);
    iVar7 = strcmp(pcVar4,"-");
    if ((iVar7 == 0) && (iVar7 = strcmp(*(char **)(lVar2 + -8 + (ulong)nrec * 8),"--"), iVar7 != 0))
    {
      pcVar4 = (char *)0x0;
    }
    iVar7 = luaL_loadfile(L,pcVar4);
    if (iVar7 == 0) {
      lua_getfield(L,-0x2712,"arg");
      iVar7 = lua_type(L,-1);
      if (iVar7 == 5) {
        uVar9 = 0;
        iVar7 = 1;
        do {
          uVar9 = uVar9 - 1;
          lua_rawgeti(L,uVar9,iVar7);
          iVar3 = lua_type(L,-1);
          iVar7 = iVar7 + 1;
        } while (iVar3 != 0);
        lua_settop(L,-2);
        lua_remove(L,uVar9);
        uVar9 = ~uVar9;
      }
      else {
        lua_settop(L,-2);
        uVar9 = 0;
      }
      iVar7 = docall(L,uVar9,0);
    }
    report(L,iVar7);
    smain_2 = iVar7;
    if (iVar7 != 0) {
      return 0;
    }
  }
  if ((uVar6 & 1) == 0) {
    if ((uVar6 & 6) != 0) {
      return 0;
    }
    if (smain_1 != nrec) {
      return 0;
    }
    iVar7 = isatty(0);
    if (iVar7 == 0) {
      dofile(L,(char *)0x0);
      return 0;
    }
    fputs("LuaJIT 2.1.1741897244 -- Copyright (C) 2005-2023 Mike Pall. https://luajit.org/\n",
          _stdout);
  }
  print_jit_status(L);
  dotty(L);
  return 0;
}

Assistant:

static int pmain(lua_State *L)
{
  struct Smain *s = &smain;
  char **argv = s->argv;
  int argn;
  int flags = 0;
  globalL = L;
  LUAJIT_VERSION_SYM();  /* Linker-enforced version check. */

  argn = collectargs(argv, &flags);
  if (argn < 0) {  /* Invalid args? */
    print_usage();
    s->status = 1;
    return 0;
  }

  if ((flags & FLAGS_NOENV)) {
    lua_pushboolean(L, 1);
    lua_setfield(L, LUA_REGISTRYINDEX, "LUA_NOENV");
  }

  /* Stop collector during library initialization. */
  lua_gc(L, LUA_GCSTOP, 0);
  luaL_openlibs(L);
  lua_gc(L, LUA_GCRESTART, -1);

  createargtable(L, argv, s->argc, argn);

  if (!(flags & FLAGS_NOENV)) {
    s->status = handle_luainit(L);
    if (s->status != LUA_OK) return 0;
  }

  if ((flags & FLAGS_VERSION)) print_version();

  s->status = runargs(L, argv, argn);
  if (s->status != LUA_OK) return 0;

  if (s->argc > argn) {
    s->status = handle_script(L, argv + argn);
    if (s->status != LUA_OK) return 0;
  }

  if ((flags & FLAGS_INTERACTIVE)) {
    print_jit_status(L);
    dotty(L);
  } else if (s->argc == argn && !(flags & (FLAGS_EXEC|FLAGS_VERSION))) {
    if (lua_stdin_is_tty()) {
      print_version();
      print_jit_status(L);
      dotty(L);
    } else {
      dofile(L, NULL);  /* Executes stdin as a file. */
    }
  }
  return 0;
}